

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Instance * parse(Instance *__return_storage_ptr__,char *filepath)

{
  int32_t *piVar1;
  Vec2d *pVVar2;
  _Bool _Var3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int32_t idx;
  double local_58;
  double demand;
  double y;
  double x;
  int32_t *local_38;
  
  __stream = fopen(filepath,"r");
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->comment = (char *)0x0;
  __return_storage_ptr__->num_customers = 0;
  __return_storage_ptr__->num_vehicles = 0;
  __return_storage_ptr__->vehicle_cap = 0.0;
  *(undefined8 *)&__return_storage_ptr__->rounding_strat = 0;
  __return_storage_ptr__->positions = (Vec2d *)0x0;
  __return_storage_ptr__->demands = (double *)0x0;
  __return_storage_ptr__->profits = (double *)0x0;
  __return_storage_ptr__->edge_weight = (double *)0x0;
  pcVar5 = os_get_fext(filepath);
  if (pcVar5 == (char *)0x0) {
    if (__stream == (FILE *)0x0) goto LAB_00104176;
  }
  else {
    if (__stream == (FILE *)0x0) goto LAB_00104176;
    iVar4 = strcmp(pcVar5,"simplified-vrp");
    if (iVar4 == 0) {
      piVar1 = &__return_storage_ptr__->num_customers;
      iVar4 = __isoc99_fscanf(__stream,"%d %d %lf",piVar1,&__return_storage_ptr__->num_vehicles,
                              &__return_storage_ptr__->vehicle_cap);
      if (iVar4 == 3) {
        _Var3 = expect_newline((FILE *)__stream,filepath,1);
        if (_Var3) {
          _Var3 = prep_memory(__return_storage_ptr__);
          if (!_Var3) {
            uVar7 = (ulong)(uint)*piVar1;
            pcVar5 = "%s: Failed to allocate memory for %d customers\n";
            goto LAB_00104144;
          }
          local_38 = piVar1;
          uVar9 = 0xffffffff;
          while( true ) {
            idx = 0;
            x = 0.0;
            y = 0.0;
            demand = 0.0;
            local_58 = 0.0;
            iVar4 = __isoc99_fscanf(__stream,"%d %lf %lf %lf %lf",&idx,&x,&y,&demand,&local_58);
            if (iVar4 != 5) break;
            uVar8 = uVar9 + 1;
            if (uVar8 != idx) {
              fprintf(_stderr,"%s: Parsing error at line %d. Expected idx %d but found %d\n",
                      filepath,(ulong)(uVar9 + 3),(ulong)uVar8);
              goto LAB_001040eb;
            }
            _Var3 = expect_newline((FILE *)__stream,filepath,uVar9 + 3);
            if (!_Var3) goto LAB_001040eb;
            pVVar2 = __return_storage_ptr__->positions;
            lVar6 = (long)idx;
            pVVar2[lVar6].x = x;
            pVVar2[lVar6].y = y;
            __return_storage_ptr__->demands[lVar6] = demand;
            __return_storage_ptr__->profits[lVar6] = local_58;
            uVar9 = uVar8;
          }
          if (iVar4 != -1) {
            fprintf(_stderr,"%s: Parsing error at line %d\n",filepath);
          }
LAB_001040eb:
          if (*local_38 == uVar9) {
            fclose(__stream);
            goto LAB_001040ff;
          }
          fprintf(_stderr,"%s: Expected %d customers but found %d\n",filepath,(ulong)(uint)*local_38
                  ,(ulong)uVar9);
        }
      }
      else {
        pcVar5 = "%s: Parsing error at line %d\n";
        uVar7 = 1;
LAB_00104144:
        fprintf(_stderr,pcVar5,filepath,uVar7);
      }
      fclose(__stream);
      goto LAB_00104176;
    }
  }
  _Var3 = parse_vrp_file(__return_storage_ptr__,(FILE *)__stream,filepath);
  fclose(__stream);
  if (_Var3) {
LAB_001040ff:
    if ((__return_storage_ptr__->name != (char *)0x0) && (*__return_storage_ptr__->name != '\0')) {
      return __return_storage_ptr__;
    }
    instance_set_name(__return_storage_ptr__,filepath);
    return __return_storage_ptr__;
  }
LAB_00104176:
  instance_destroy(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Instance parse(const char *filepath) {
    return parse_impl(filepath, PARSING_FILE_EXT_AUTODETECT);
}